

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::MethodAST::~MethodAST(MethodAST *this)

{
  MethodAST *this_local;
  
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__MethodAST_0020ce40;
  if (this->header != (MethodHeader *)0x0) {
    (*(this->header->super_Node)._vptr_Node[1])();
  }
  if (this->pragmaList != (PragmaList *)0x0) {
    (*(this->pragmaList->super_Node)._vptr_Node[1])();
  }
  if (this->body != (SequenceNode *)0x0) {
    (*(this->body->super_Node)._vptr_Node[1])();
  }
  Ref<Lodtalk::MethodASTHandle>::~Ref(&this->astHandle);
  FunctionalNode::~FunctionalNode(&this->super_FunctionalNode);
  return;
}

Assistant:

MethodAST::~MethodAST()
{
	delete header;
    delete pragmaList;
	delete body;
}